

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O1

void __thiscall
CETime::CETime(CETime *this,vector<double,_std::allocator<double>_> *time,CETimeType time_format)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  size_type sVar4;
  
  this->_vptr_CETime = (_func_int **)&PTR__CETime_00166d18;
  std::vector<double,_std::allocator<double>_>::vector(&this->time_);
  init_members(this);
  this->time_type_ = time_format;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(time);
  if (sVar2 != 0) {
    sVar2 = 0;
    do {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](time,sVar2);
      vVar1 = *pvVar3;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&this->time_,sVar2);
      *pvVar3 = vVar1;
      if (sVar2 == 3) {
        return;
      }
      sVar2 = sVar2 + 1;
      sVar4 = std::vector<double,_std::allocator<double>_>::size(time);
    } while (sVar2 < sVar4);
  }
  return;
}

Assistant:

CETime::CETime(std::vector<double> time, CETimeType time_format)
{
    init_members();
    time_type_ = time_format;
    // Just in case the passed "time" variable isnt the same length
    for (size_t i=0; i<time.size(); i++) {
        time_[i] = time[i] ;
        // In case "time" has more than 4 elements,
        // quit when we've stored the first 4
        if (i==3) break ;
    }
}